

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_fma.cpp
# Opt level: O1

void ncnn::quantize_pack4to1
               (float *ptr,char *s8ptr0,char *s8ptr1,char *s8ptr2,char *s8ptr3,Mat *scale_data,
               int elemcount)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pfVar1 = (float *)scale_data->data;
  if (scale_data->w < 2) {
    fVar5 = *pfVar1;
    fVar6 = fVar5;
    fVar7 = fVar5;
    fVar8 = fVar5;
  }
  else {
    fVar5 = *pfVar1;
    fVar6 = pfVar1[1];
    fVar7 = pfVar1[2];
    fVar8 = pfVar1[3];
  }
  uVar2 = 0;
  if (7 < elemcount) {
    uVar2 = elemcount & 0x7ffffff8;
    iVar4 = 7;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar11._8_4_ = 0x3f000000;
    auVar11._0_8_ = 0x3f0000003f000000;
    auVar11._12_4_ = 0x3f000000;
    auVar13._8_4_ = 0x7f007f;
    auVar13._0_8_ = 0x7f007f007f007f;
    auVar13._12_4_ = 0x7f007f;
    auVar15._8_4_ = 0xff81ff81;
    auVar15._0_8_ = 0xff81ff81ff81ff81;
    auVar15._12_4_ = 0xff81ff81;
    do {
      auVar26._0_4_ = fVar5 * *ptr;
      auVar26._4_4_ = fVar6 * ptr[1];
      auVar26._8_4_ = fVar7 * ptr[2];
      auVar26._12_4_ = fVar8 * ptr[3];
      auVar21._0_4_ = fVar5 * ptr[4];
      auVar21._4_4_ = fVar6 * ptr[5];
      auVar21._8_4_ = fVar7 * ptr[6];
      auVar21._12_4_ = fVar8 * ptr[7];
      auVar28._0_4_ = fVar5 * ptr[8];
      auVar28._4_4_ = fVar6 * ptr[9];
      auVar28._8_4_ = fVar7 * ptr[10];
      auVar28._12_4_ = fVar8 * ptr[0xb];
      auVar17._0_4_ = fVar5 * ptr[0xc];
      auVar17._4_4_ = fVar6 * ptr[0xd];
      auVar17._8_4_ = fVar7 * ptr[0xe];
      auVar17._12_4_ = fVar8 * ptr[0xf];
      auVar30._0_4_ = fVar5 * ptr[0x10];
      auVar30._4_4_ = fVar6 * ptr[0x11];
      auVar30._8_4_ = fVar7 * ptr[0x12];
      auVar30._12_4_ = fVar8 * ptr[0x13];
      auVar23._0_4_ = fVar5 * ptr[0x14];
      auVar23._4_4_ = fVar6 * ptr[0x15];
      auVar23._8_4_ = fVar7 * ptr[0x16];
      auVar23._12_4_ = fVar8 * ptr[0x17];
      auVar33._0_4_ = fVar5 * ptr[0x18];
      auVar33._4_4_ = fVar6 * ptr[0x19];
      auVar33._8_4_ = fVar7 * ptr[0x1a];
      auVar33._12_4_ = fVar8 * ptr[0x1b];
      auVar10 = vandps_avx(auVar26,auVar9);
      auVar24 = vorps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar30,auVar9);
      auVar18 = vorps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar28,auVar9);
      auVar25 = vorps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar33,auVar9);
      auVar10 = vorps_avx(auVar10,auVar11);
      auVar27._0_4_ = (int)(auVar26._0_4_ + auVar24._0_4_);
      auVar27._4_4_ = (int)(auVar26._4_4_ + auVar24._4_4_);
      auVar27._8_4_ = (int)(auVar26._8_4_ + auVar24._8_4_);
      auVar27._12_4_ = (int)(auVar26._12_4_ + auVar24._12_4_);
      auVar31._0_4_ = (int)(auVar30._0_4_ + auVar18._0_4_);
      auVar31._4_4_ = (int)(auVar30._4_4_ + auVar18._4_4_);
      auVar31._8_4_ = (int)(auVar30._8_4_ + auVar18._8_4_);
      auVar31._12_4_ = (int)(auVar30._12_4_ + auVar18._12_4_);
      auVar24 = vpackssdw_avx(auVar27,auVar31);
      auVar32._0_4_ = fVar5 * ptr[0x1c];
      auVar32._4_4_ = fVar6 * ptr[0x1d];
      auVar32._8_4_ = fVar7 * ptr[0x1e];
      auVar32._12_4_ = fVar8 * ptr[0x1f];
      auVar29._0_4_ = (int)(auVar28._0_4_ + auVar25._0_4_);
      auVar29._4_4_ = (int)(auVar28._4_4_ + auVar25._4_4_);
      auVar29._8_4_ = (int)(auVar28._8_4_ + auVar25._8_4_);
      auVar29._12_4_ = (int)(auVar28._12_4_ + auVar25._12_4_);
      auVar34._0_4_ = (int)(auVar33._0_4_ + auVar10._0_4_);
      auVar34._4_4_ = (int)(auVar33._4_4_ + auVar10._4_4_);
      auVar34._8_4_ = (int)(auVar33._8_4_ + auVar10._8_4_);
      auVar34._12_4_ = (int)(auVar33._12_4_ + auVar10._12_4_);
      auVar10 = vpackssdw_avx(auVar29,auVar34);
      auVar24 = vpminsw_avx(auVar24,auVar13);
      auVar18 = vpminsw_avx(auVar10,auVar13);
      auVar10 = vpmaxsw_avx(auVar24,auVar15);
      auVar24 = vpmaxsw_avx(auVar18,auVar15);
      auVar26 = vpacksswb_avx(auVar10,auVar24);
      auVar10 = vandps_avx(auVar21,auVar9);
      auVar24 = vorps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar23,auVar9);
      auVar18 = vorps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar17,auVar9);
      auVar25 = vorps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar32,auVar9);
      auVar10 = vorps_avx(auVar10,auVar11);
      auVar22._0_4_ = (int)(auVar24._0_4_ + auVar21._0_4_);
      auVar22._4_4_ = (int)(auVar24._4_4_ + auVar21._4_4_);
      auVar22._8_4_ = (int)(auVar24._8_4_ + auVar21._8_4_);
      auVar22._12_4_ = (int)(auVar24._12_4_ + auVar21._12_4_);
      auVar24._0_4_ = (int)(auVar18._0_4_ + auVar23._0_4_);
      auVar24._4_4_ = (int)(auVar18._4_4_ + auVar23._4_4_);
      auVar24._8_4_ = (int)(auVar18._8_4_ + auVar23._8_4_);
      auVar24._12_4_ = (int)(auVar18._12_4_ + auVar23._12_4_);
      auVar24 = vpackssdw_avx(auVar22,auVar24);
      auVar18._0_4_ = (int)(auVar25._0_4_ + auVar17._0_4_);
      auVar18._4_4_ = (int)(auVar25._4_4_ + auVar17._4_4_);
      auVar18._8_4_ = (int)(auVar25._8_4_ + auVar17._8_4_);
      auVar18._12_4_ = (int)(auVar25._12_4_ + auVar17._12_4_);
      auVar25._0_4_ = (int)(auVar32._0_4_ + auVar10._0_4_);
      auVar25._4_4_ = (int)(auVar32._4_4_ + auVar10._4_4_);
      auVar25._8_4_ = (int)(auVar32._8_4_ + auVar10._8_4_);
      auVar25._12_4_ = (int)(auVar32._12_4_ + auVar10._12_4_);
      auVar10 = vpackssdw_avx(auVar18,auVar25);
      auVar24 = vpminsw_avx(auVar24,auVar13);
      auVar18 = vpminsw_avx(auVar10,auVar13);
      auVar10 = vpmaxsw_avx(auVar24,auVar15);
      auVar24 = vpmaxsw_avx(auVar18,auVar15);
      auVar10 = vpacksswb_avx(auVar10,auVar24);
      auVar24 = vpunpcklbw_avx(auVar26,auVar10);
      auVar10 = vpunpckhbw_avx(auVar26,auVar10);
      auVar18 = vpunpcklwd_avx(auVar24,auVar10);
      auVar10 = vpunpckhwd_avx(auVar24,auVar10);
      auVar25 = vpunpckldq_avx(auVar18,auVar10);
      auVar24 = vpunpckhdq_avx(auVar18,auVar10);
      *(long *)s8ptr0 = auVar25._0_8_;
      auVar10 = vpshufd_avx(auVar25,0x4e);
      *(long *)s8ptr1 = auVar10._0_8_;
      *(long *)s8ptr2 = auVar24._0_8_;
      auVar10 = vpshufd_avx(auVar24,0x4e);
      *(long *)s8ptr3 = auVar10._0_8_;
      ptr = ptr + 0x20;
      s8ptr0 = s8ptr0 + 8;
      s8ptr1 = s8ptr1 + 8;
      s8ptr2 = s8ptr2 + 8;
      s8ptr3 = s8ptr3 + 8;
      iVar4 = iVar4 + 8;
    } while (iVar4 < elemcount);
  }
  if ((int)uVar2 < elemcount) {
    lVar3 = 0;
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar12._8_4_ = 0x3f000000;
    auVar12._0_8_ = 0x3f0000003f000000;
    auVar12._12_4_ = 0x3f000000;
    auVar14._8_4_ = 0x7f007f;
    auVar14._0_8_ = 0x7f007f007f007f;
    auVar14._12_4_ = 0x7f007f;
    auVar16._8_4_ = 0xff81ff81;
    auVar16._0_8_ = 0xff81ff81ff81ff81;
    auVar16._12_4_ = 0xff81ff81;
    do {
      auVar19._0_4_ = fVar5 * *ptr;
      auVar19._4_4_ = fVar6 * ptr[1];
      auVar19._8_4_ = fVar7 * ptr[2];
      auVar19._12_4_ = fVar8 * ptr[3];
      auVar9 = vandps_avx(auVar19,auVar10);
      auVar9 = vorps_avx(auVar9,auVar12);
      auVar20._0_4_ = (int)(auVar19._0_4_ + auVar9._0_4_);
      auVar20._4_4_ = (int)(auVar19._4_4_ + auVar9._4_4_);
      auVar20._8_4_ = (int)(auVar19._8_4_ + auVar9._8_4_);
      auVar20._12_4_ = (int)(auVar19._12_4_ + auVar9._12_4_);
      auVar9 = vpackssdw_avx(auVar20,auVar20);
      auVar9 = vpminsw_avx(auVar9,auVar14);
      auVar9 = vpmaxsw_avx(auVar9,auVar16);
      auVar9 = vpacksswb_avx(auVar9,auVar9);
      s8ptr0[lVar3] = auVar9[4];
      s8ptr1[lVar3] = auVar9[5];
      s8ptr2[lVar3] = auVar9[6];
      s8ptr3[lVar3] = auVar9[7];
      ptr = ptr + 4;
      lVar3 = lVar3 + 1;
    } while (elemcount - uVar2 != (int)lVar3);
  }
  return;
}

Assistant:

static void quantize_pack4to1(const float* ptr, signed char* s8ptr0, signed char* s8ptr1, signed char* s8ptr2, signed char* s8ptr3, const Mat& scale_data, int elemcount)
{
    const int scale_data_size = scale_data.w;

    // NCNN_LOGE("quantize_pack4to1 %d   %d", scale_data_size, elemcount);

    float scale = scale_data[0];
    __m128 _scale = _mm_set1_ps(scale);
    if (scale_data_size > 1)
    {
        _scale = _mm_loadu_ps((const float*)scale_data);
    }

    int i = 0;
    for (; i + 7 < elemcount; i += 8)
    {
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        __m128 _v2 = _mm_loadu_ps(ptr + 8);
        __m128 _v3 = _mm_loadu_ps(ptr + 12);
        __m128 _v4 = _mm_loadu_ps(ptr + 16);
        __m128 _v5 = _mm_loadu_ps(ptr + 20);
        __m128 _v6 = _mm_loadu_ps(ptr + 24);
        __m128 _v7 = _mm_loadu_ps(ptr + 28);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        _v2 = _mm_mul_ps(_v2, _scale);
        _v3 = _mm_mul_ps(_v3, _scale);
        _v4 = _mm_mul_ps(_v4, _scale);
        _v5 = _mm_mul_ps(_v5, _scale);
        _v6 = _mm_mul_ps(_v6, _scale);
        _v7 = _mm_mul_ps(_v7, _scale);
        __m128i v0426 = float2int8_sse(_v0, _v4, _v2, _v6);
        __m128i v1537 = float2int8_sse(_v1, _v5, _v3, _v7);
        __m128i v0145 = _mm_unpacklo_epi8(v0426, v1537);
        __m128i v2367 = _mm_unpackhi_epi8(v0426, v1537);
        __m128i v0123 = _mm_unpacklo_epi16(v0145, v2367);
        __m128i v4567 = _mm_unpackhi_epi16(v0145, v2367);
        __m128i v01 = _mm_unpacklo_epi32(v0123, v4567);
        __m128i v23 = _mm_unpackhi_epi32(v0123, v4567);
        _mm_storel_pd((double*)s8ptr0, _mm_castsi128_pd(v01));
        _mm_storeh_pd((double*)s8ptr1, _mm_castsi128_pd(v01));
        _mm_storel_pd((double*)s8ptr2, _mm_castsi128_pd(v23));
        _mm_storeh_pd((double*)s8ptr3, _mm_castsi128_pd(v23));
        ptr += 32;
        s8ptr0 += 8;
        s8ptr1 += 8;
        s8ptr2 += 8;
        s8ptr3 += 8;
    }
    for (; i < elemcount; i++)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int64_t v = float2int8_sse(_v, _v);
        s8ptr0[0] = (v >> 32) & 0xff;
        s8ptr1[0] = (v >> 40) & 0xff;
        s8ptr2[0] = (v >> 48) & 0xff;
        s8ptr3[0] = (v >> 56) & 0xff;
        ptr += 4;
        s8ptr0 += 1;
        s8ptr1 += 1;
        s8ptr2 += 1;
        s8ptr3 += 1;
    }
}